

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  pointer pFVar1;
  pointer pPVar2;
  int iVar3;
  pointer pPVar4;
  pointer pFVar5;
  bool bVar6;
  bool bVar7;
  
  pFVar5 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pFVar5 == pFVar1) {
    bVar6 = false;
  }
  else {
    do {
      pPVar4 = (pFVar5->m_patterns).
               super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (pFVar5->m_patterns).
               super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = pPVar4 == pPVar2;
      bVar7 = bVar6;
      while( true ) {
        if (bVar7) {
          return true;
        }
        iVar3 = (*(pPVar4->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
                  _vptr_NonCopyable[4])(pPVar4->m_p,testCase);
        if ((char)iVar3 == '\0') break;
        pPVar4 = pPVar4 + 1;
        bVar7 = pPVar4 == pPVar2;
      }
      pFVar5 = pFVar5 + 1;
    } while (pFVar5 != pFVar1);
  }
  return bVar6;
}

Assistant:

Generic::AllOf<ExpressionT> Matcher<ExpressionT>::operator && ( Matcher<ExpressionT> const& other ) const {
        Generic::AllOf<ExpressionT> allOfExpr;
        allOfExpr.add( *this );
        allOfExpr.add( other );
        return allOfExpr;
    }